

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockCallTest_expectOneCallInScopeButActualCallInGlobal_TestShell::createTest
          (TEST_MockCallTest_expectOneCallInScopeButActualCallInGlobal_TestShell *this)

{
  Utest *this_00;
  TEST_MockCallTest_expectOneCallInScopeButActualCallInGlobal_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
                                  ,0x9b);
  TEST_MockCallTest_expectOneCallInScopeButActualCallInGlobal_Test::
  TEST_MockCallTest_expectOneCallInScopeButActualCallInGlobal_Test
            ((TEST_MockCallTest_expectOneCallInScopeButActualCallInGlobal_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockCallTest, expectOneCallInScopeButActualCallInGlobal)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest emptyExpectations;
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "foo", emptyExpectations);

    mock("scope").expectOneCall("foo");
    mock().actualCall("foo");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
    mock().clear();
}